

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

int verify_miniscript_and_n(miniscript_node_t *node,miniscript_node_t *parent)

{
  miniscript_node_t *pmVar1;
  miniscript_node_t *pmVar2;
  uint32_t uVar3;
  int iVar4;
  bool bVar5;
  
  iVar4 = 0;
  pmVar1 = node->child;
  for (pmVar2 = pmVar1; pmVar2 != (miniscript_node_t *)0x0; pmVar2 = pmVar2->next) {
    iVar4 = iVar4 + 1;
  }
  bVar5 = iVar4 == node->info->inner_num;
  if (bVar5) {
    uVar3 = verify_miniscript_andor_property
                      (pmVar1->type_properties,pmVar1->next->type_properties,0x3b901);
    node->type_properties = uVar3;
    bVar5 = uVar3 != 0;
  }
  return (uint)bVar5 * 2 + -2;
}

Assistant:

static int verify_miniscript_and_n(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    int ret = verify_miniscript_two_param_check(node, parent);
    if (ret == WALLY_OK) {
        node->type_properties = verify_miniscript_andor_property(
            node->child->type_properties,
            node->child->next->type_properties,
            MINISCRIPT_PROPERTY_OP_0);
        if (!node->type_properties)
            ret = WALLY_EINVAL;
    }
    return ret;
}